

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O0

int dlep_session_update_extensions
              (dlep_session *session,uint8_t *extvalues,size_t extcount,_Bool radio)

{
  oonf_log_source oVar1;
  bool bVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  int iVar5;
  avl_tree *paVar6;
  dlep_extension *local_88;
  uint16_t extid;
  ulong uStack_78;
  _Bool deactivate;
  size_t j;
  size_t i;
  dlep_extension *ext;
  _Bool radio_local;
  size_t extcount_local;
  uint8_t *extvalues_local;
  dlep_session *session_local;
  uint local_1c [3];
  long local_10;
  
  if (((&log_global_mask)[session->log_source] & 2) != 0) {
    oonf_log(2,session->log_source,"src/generic/dlep/dlep_session.c",0xef,0,0,
             "Update session extension list");
  }
  uStack_78 = 3;
  do {
    if ((session->parser).extension_count <= uStack_78) {
      (session->parser).extension_count = 3;
      for (j = 0; j < extcount; j = j + 1) {
        uVar3 = *(uint16_t *)(extvalues + j * 2);
        uVar4 = ntohs(uVar3);
        local_1c[0] = (uint)uVar4;
        paVar6 = dlep_extension_get_tree();
        local_10 = avl_find(paVar6,local_1c);
        local_1c[1] = 0x90;
        local_1c[2] = 0;
        if (local_10 == 0) {
          local_88 = (dlep_extension *)0x0;
        }
        else {
          local_88 = (dlep_extension *)(local_10 + -0x90);
        }
        if (local_88 != (dlep_extension *)0x0) {
          if (((&log_global_mask)[session->log_source] & 2) != 0) {
            oVar1 = session->log_source;
            uVar3 = ntohs(uVar3);
            oonf_log(2,oVar1,"src/generic/dlep/dlep_session.c",0x10e,0,0,"Add extension: %d",uVar3);
          }
          (session->parser).extensions[(session->parser).extension_count] = local_88;
          (session->parser).extension_count = (session->parser).extension_count + 1;
        }
      }
      iVar5 = _update_allowed_tlvs(session);
      return iVar5;
    }
    bVar2 = true;
    for (j = 0; j < extcount; j = j + 1) {
      uVar3 = ntohs(*(uint16_t *)(extvalues + j * 2));
      if ((uint)uVar3 == (session->parser).extensions[uStack_78]->id) {
        bVar2 = false;
        break;
      }
    }
    if (bVar2) {
      if (radio) {
        (*(session->parser).extensions[uStack_78]->cb_session_deactivate_radio)(session);
      }
      else {
        (*(session->parser).extensions[uStack_78]->cb_session_deactivate_router)(session);
      }
    }
    uStack_78 = uStack_78 + 1;
  } while( true );
}

Assistant:

int
dlep_session_update_extensions(struct dlep_session *session, const uint8_t *extvalues, size_t extcount, bool radio) {
  struct dlep_extension *ext;
  size_t i, j;
  bool deactivate;
  uint16_t extid;
  OONF_INFO(session->log_source, "Update session extension list");

  /* deactivate all extensions not present anymore  */
  for (j = DLEP_EXTENSION_BASE_COUNT; j < session->parser.extension_count; j++) {
    deactivate = true;

    for (i = 0; i < extcount; i++) {
      memcpy(&extid, &extvalues[i * 2], sizeof(extid));
      if (ntohs(extid) == session->parser.extensions[j]->id) {
        deactivate = false;
        break;
      }
    }

    if (deactivate) {
      if (radio) {
        session->parser.extensions[j]->cb_session_deactivate_radio(session);
      }
      else {
        session->parser.extensions[j]->cb_session_deactivate_router(session);
      }
    }
  }

  /* generate new session extension list */
  session->parser.extension_count = DLEP_EXTENSION_BASE_COUNT;
  for (i = 0; i < extcount; i++) {
    memcpy(&extid, &extvalues[i * 2], sizeof(extid));

    ext = dlep_extension_get(ntohs(extid));
    if (ext) {
      OONF_INFO(session->log_source, "Add extension: %d", ntohs(extid));

      session->parser.extensions[session->parser.extension_count] = ext;
      session->parser.extension_count++;
    }
  }
  return _update_allowed_tlvs(session);
}